

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

int flatbuffers::JsonPrinter::GetFieldDefault<int>(FieldDef *fd)

{
  bool bVar1;
  uint in_EAX;
  int val;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  bVar1 = StringToNumber<int>((fd->value).constant._M_dataplus._M_p,(int *)((long)&uStack_8 + 4));
  if (bVar1) {
    return uStack_8._4_4_;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = int]");
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }